

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::ZmpTrackingGainEstimator::resetWithMeasurements
          (ZmpTrackingGainEstimator *this,Vector2 *initZMP,Vector3 *initGain,Matrix2 *yaw,
          Vector2 *initZMPUncertainty,Vector3 *initGainUncertainty)

{
  LinearKalmanFilter *this_00;
  double **ppdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  DstEvaluatorType dstEvaluator;
  double *pdVar8;
  CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *pCVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  uint uVar14;
  ulong uVar15;
  SrcEvaluatorType srcEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  DenseStorage<double,__1,__1,__1,_0> *pDVar16;
  Matrix5 P;
  Vector5 x;
  DenseStorage<double,__1,__1,__1,_0> *local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  Vector3 *local_1d8;
  Vector2 *local_1d0;
  DenseStorage<double,__1,__1,__1,_0> local_1c8;
  double local_1b0 [21];
  double local_108;
  DenseStorage<double,__1,__1,__1,_0> local_f8;
  undefined8 local_e0;
  double dStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  double local_b8;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  DenseBase<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>
  local_78 [8];
  undefined8 local_70;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_68 [8];
  undefined8 local_60;
  double local_58 [5];
  
  this_00 = &this->filter_;
  local_1d8 = initGainUncertainty;
  local_1d0 = initZMPUncertainty;
  KalmanFilterBase::reset(&this_00->super_KalmanFilterBase);
  dVar2 = (this->zmpProcessErrorStd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
          m_storage.m_data.array[0];
  dVar3 = (this->zmpProcessErrorStd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
          m_storage.m_data.array[1];
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[0]
       = dVar2 * dVar2;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[1]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[5]
       = 0.0;
  (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array[6]
       = dVar3 * dVar3;
  dVar3 = (this->gainDriftPerSecondStd_).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  dVar4 = (this->gainDriftPerSecondStd_).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  dVar2 = (this->gainDriftPerSecondStd_).
          super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_1b0[0] = 0.0;
  local_1b0[2] = 0.0;
  local_1b0[3] = 0.0;
  local_1c8.m_rows = 0;
  local_1c8.m_cols = 0;
  local_1b0[4] = 0.0;
  local_1c8.m_data = (double *)(dVar3 * dVar3);
  local_1b0[1] = dVar4 * dVar4;
  local_1b0[5] = dVar2 * dVar2;
  pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
           array + 0xe;
  lVar11 = 0x10;
  do {
    dVar2 = *(double *)((long)&local_1d0 + lVar11);
    pdVar8[-2] = *(double *)((long)&local_1d8 + lVar11);
    pdVar8[-1] = dVar2;
    *pdVar8 = *(double *)((long)&local_1c8.m_data + lVar11);
    lVar11 = lVar11 + 0x18;
    pdVar8 = pdVar8 + 5;
  } while (lVar11 != 0x58);
  local_1c8.m_data = (double *)0x0;
  local_1c8.m_rows = 0;
  local_1c8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1c8,0x19,5,5);
  if ((local_1c8.m_rows == 5) && (local_1c8.m_cols == 5)) {
LAB_00181267:
    uVar12 = 0xfffffffffffffffe;
    do {
      pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.
               m_data.array + uVar12 + 2;
      dVar2 = pdVar8[1];
      local_1c8.m_data[uVar12 + 2] = *pdVar8;
      (local_1c8.m_data + uVar12 + 2)[1] = dVar2;
      uVar12 = uVar12 + 2;
    } while (uVar12 < 0x16);
    local_1c8.m_data[0x18] =
         (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.
         array[0x18];
    (*(this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
      _vptr_ObserverBase[0x31])(this_00,&local_1c8);
    free(local_1c8.m_data);
    dVar2 = (this->zmpMeasureErrorstd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
            .m_storage.m_data.array[0];
    dVar3 = (this->zmpMeasureErrorstd_).super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
            .m_storage.m_data.array[1];
    (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = dVar2 * dVar2;
    (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = 0.0;
    (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = 0.0;
    (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [3] = dVar3 * dVar3;
    local_1c8.m_data = (double *)0x0;
    local_1c8.m_rows = 0;
    local_1c8.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1c8,4,2,2);
    if ((local_1c8.m_rows != 2) || (local_1c8.m_cols != 2)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1c8,4,2,2);
      if ((local_1c8.m_rows != 2) || (local_1c8.m_cols != 2)) {
        pcVar13 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 2>, T1 = double, T2 = double]"
        ;
        goto LAB_0018171b;
      }
    }
    dVar2 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data
            .array[1];
    *local_1c8.m_data =
         (this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
         array[0];
    local_1c8.m_data[1] = dVar2;
    uVar5 = *(undefined4 *)
             ((long)(this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array + 0x14);
    uVar6 = *(undefined4 *)
             ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
              m_data.array + 3);
    uVar7 = *(undefined4 *)
             ((long)(this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                    m_storage.m_data.array + 0x1c);
    *(undefined4 *)(local_1c8.m_data + 2) =
         *(undefined4 *)
          ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.
           array + 2);
    *(undefined4 *)((long)local_1c8.m_data + 0x14) = uVar5;
    *(undefined4 *)(local_1c8.m_data + 3) = uVar6;
    *(undefined4 *)((long)local_1c8.m_data + 0x1c) = uVar7;
    (*(this->filter_).super_KalmanFilterBase.super_ZeroDelayObserver.super_ObserverBase.
      _vptr_ObserverBase[0x2e])(this_00);
    free(local_1c8.m_data);
    local_1c8.m_data = &local_a8;
    local_1c8.m_rows = 0;
    local_1c8.m_cols = 1;
    local_1b0[0] = 9.88131291682493e-324;
    local_a8 = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
               m_data.array[0];
    dStack_a0 = (initZMP->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                m_data.array[1];
    Eigen::CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>> *)&local_1c8,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)initGain);
    if (((long)local_1b0[0] + local_1c8.m_rows != 5) || (local_1c8.m_cols != 1)) {
      pcVar13 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 5, 1>>::finished() [MatrixType = Eigen::Matrix<double, 5, 1>]"
      ;
LAB_0018175b:
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar13);
    }
    local_1c8.m_data = (double *)0x0;
    local_1c8.m_rows = 0;
    pdVar8 = (double *)malloc(0x28);
    if (((ulong)pdVar8 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar8 == (double *)0x0) {
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = operator_delete;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_1c8.m_rows = 5;
    *pdVar8 = local_a8;
    pdVar8[1] = dStack_a0;
    pdVar8[2] = local_98;
    pdVar8[3] = dStack_90;
    pdVar8[4] = local_88;
    local_1c8.m_data = pdVar8;
    ZeroDelayObserver::setState((ZeroDelayObserver *)this_00,(StateVector *)&local_1c8,0);
    free(local_1c8.m_data);
    dVar2 = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.
            array[1];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [0] = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
          [0];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [1] = dVar2;
    dVar2 = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.
            array[3];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [2] = (yaw->super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>).m_storage.m_data.array
          [2];
    (this->yaw_).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
    [3] = dVar2;
    dVar2 = (local_1d0->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
            m_data.array[0];
    dVar3 = (local_1d0->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
            m_data.array[1];
    pdVar8 = local_58;
    local_58[1] = 0.0;
    local_58[2] = 0.0;
    local_58[0] = dVar2 * dVar2;
    local_58[3] = dVar3 * dVar3;
    local_1f0 = 0;
    lVar11 = 2;
    local_1e8 = 2;
    local_1e0 = 2;
    uVar14 = (uint)((ulong)&local_1c8 >> 3);
    pDVar16 = &local_1c8;
    do {
      uVar12 = (ulong)(uVar14 & 1);
      if (uVar12 != 0) {
        (((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pDVar16->m_data)->m_storage).
        m_data = (double *)*pdVar8;
      }
      if ((2 - uVar12 & 2) != 0) {
        dVar2 = (pdVar8 + uVar12)[1];
        ppdVar1 = &(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pDVar16->m_data)->
                   m_storage).m_data + uVar12;
        *ppdVar1 = (double *)pdVar8[uVar12];
        ppdVar1[1] = (double *)dVar2;
      }
      if (uVar12 != 0) {
        uVar15 = 2 - uVar12 & 0xfffffffffffffffe;
        (&(((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&pDVar16->m_data)->m_storage
          ).m_data)[uVar12 + uVar15] = (double *)pdVar8[uVar12 + uVar15];
      }
      uVar14 = ~(uVar14 & 1);
      pdVar8 = pdVar8 + 2;
      pDVar16 = (DenseStorage<double,__1,__1,__1,_0> *)&pDVar16[1].m_cols;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
    local_60 = 0;
    local_1f8 = &local_1c8;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)&local_1f8,local_68);
    local_70 = 0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar9,local_78);
    dVar2 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[0];
    dStack_d8 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array[1];
    local_f8.m_data = (double *)(dVar2 * dVar2);
    dStack_d8 = dStack_d8 * dStack_d8;
    local_b8 = (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
    local_b8 = local_b8 * local_b8;
    local_e0 = 0;
    local_d0 = 0;
    uStack_c8 = 0;
    local_f8.m_rows = 0;
    local_f8.m_cols = 0;
    local_c0 = 0;
    Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar9,
               (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_f8);
    if ((local_1e0 + local_1f0 != 5) || (local_1e8 != 5)) {
      pcVar13 = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 5, 5>>::finished() [MatrixType = Eigen::Matrix<double, 5, 5>]"
      ;
      goto LAB_0018175b;
    }
    local_f8.m_data = (double *)0x0;
    local_f8.m_rows = 0;
    local_f8.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_f8,0x19,5,5);
    if ((local_f8.m_rows == 5) && (local_f8.m_cols == 5)) {
LAB_00181623:
      uVar12 = 0xfffffffffffffffe;
      do {
        dVar2 = local_1b0[uVar12];
        local_f8.m_data[uVar12 + 2] = local_1b0[uVar12 - 1];
        (local_f8.m_data + uVar12 + 2)[1] = dVar2;
        uVar12 = uVar12 + 2;
      } while (uVar12 < 0x16);
      local_f8.m_data[0x18] = local_108;
      KalmanFilterBase::setStateCovariance(&this_00->super_KalmanFilterBase,(Pmatrix *)&local_f8);
      free(local_f8.m_data);
      return;
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_f8,0x19,5,5);
    if ((local_f8.m_rows == 5) && (local_f8.m_cols == 5)) goto LAB_00181623;
  }
  else {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1c8,0x19,5,5);
    if ((local_1c8.m_rows == 5) && (local_1c8.m_cols == 5)) goto LAB_00181267;
  }
  pcVar13 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 5, 5>, T1 = double, T2 = double]"
  ;
LAB_0018171b:
  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar13);
}

Assistant:

void ZmpTrackingGainEstimator::resetWithMeasurements(const Vector2 & initZMP,
                                                     const Vector3 & initGain,
                                                     const Matrix2 & yaw,
                                                     const Vector2 & initZMPUncertainty,
                                                     const Vector3 & initGainUncertainty)
{
  filter_.reset();
  updateQ_();
  updateR_();

  Vector5 x;
  x << initZMP, initGain;
  filter_.setState(x, 0);

  yaw_ = yaw;

  Matrix5 P;
  // clang-format off
  P << Vec2ToSqDiag_(initZMPUncertainty),  Matrix23::Zero(), 
       Matrix23::Zero().transpose(),       Vec3ToSqDiag_(initGainUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}